

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Copy_16_To_16(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaUint16 *src;
  PaUint16 *dest;
  
  if (count != 0) {
    do {
      *(undefined2 *)destinationBuffer = *sourceBuffer;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 2);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Copy_16_To_16(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaUint16 *src = (PaUint16 *)sourceBuffer;
    PaUint16 *dest = (PaUint16 *)destinationBuffer;
                                                        
    (void) ditherGenerator; /* unused parameter */
    
    while( count-- )
    {
        *dest = *src;

        src += sourceStride;
        dest += destinationStride;
    }
}